

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

bool __thiscall GEO::Logger::is_client(Logger *this,LoggerClient *c)

{
  int *piVar1;
  const_iterator cVar2;
  key_type local_10;
  
  if (c != (LoggerClient *)0x0) {
    piVar1 = &(c->super_Counted).nb_refs_;
    *piVar1 = *piVar1 + 1;
  }
  local_10.pointer_ = c;
  cVar2 = std::
          _Rb_tree<GEO::SmartPointer<GEO::LoggerClient>,_GEO::SmartPointer<GEO::LoggerClient>,_std::_Identity<GEO::SmartPointer<GEO::LoggerClient>_>,_std::less<GEO::SmartPointer<GEO::LoggerClient>_>,_std::allocator<GEO::SmartPointer<GEO::LoggerClient>_>_>
          ::find(&(this->clients_)._M_t,&local_10);
  SmartPointer<GEO::LoggerClient>::~SmartPointer(&local_10);
  return (_Rb_tree_header *)cVar2._M_node != &(this->clients_)._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool Logger::is_client(LoggerClient* c) const {
        return clients_.find(c) != clients_.end();
    }